

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O0

int __thiscall Thread::join(Thread *this)

{
  int iVar1;
  Thread *this_local;
  
  if ((this->started_ & 1U) == 0) {
    __assert_fail("started_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Ventery[P]WebServer/WebServer/base/Thread.cpp"
                  ,0x69,"int Thread::join()");
  }
  if (((this->joined_ ^ 0xffU) & 1) == 0) {
    __assert_fail("!joined_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Ventery[P]WebServer/WebServer/base/Thread.cpp"
                  ,0x6a,"int Thread::join()");
  }
  this->joined_ = true;
  iVar1 = pthread_join(this->pthreadId_,(void **)0x0);
  return iVar1;
}

Assistant:

int Thread::join() {
  assert(started_);
  assert(!joined_);
  joined_ = true;
  return pthread_join(pthreadId_, NULL);
}